

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O3

void print_command(string *str)

{
  int iVar1;
  undefined8 in_RAX;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar1 = std::__cxx11::string::compare((char *)str);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  | ",4);
    if (str->_M_string_length != 0) {
      pcVar4 = (str->_M_dataplus)._M_p;
      pcVar2 = pcVar4 + str->_M_string_length;
      do {
        if (*pcVar4 == '\n') {
          if (pcVar4 + 1 != pcVar2) {
            lVar3 = 5;
            pcVar2 = "\n  | ";
            goto LAB_001299bb;
          }
        }
        else {
          uStack_38 = CONCAT17(*pcVar4,(undefined7)uStack_38);
          lVar3 = 1;
          pcVar2 = (char *)((long)&uStack_38 + 7);
LAB_001299bb:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar3);
        }
        pcVar4 = pcVar4 + 1;
        pcVar2 = (str->_M_dataplus)._M_p + str->_M_string_length;
      } while (pcVar4 != pcVar2);
    }
    uStack_38._0_7_ = CONCAT16(10,(undefined6)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)((long)&uStack_38 + 6),1);
  }
  return;
}

Assistant:

void print_command(string str) {
    // if the string is not empty
    if (str != "") {
        cout << "  | ";
        for(auto it = str.begin(); it != str.end(); ++it) {
            if(*it == '\n' ) {
                // and the '\n' is not at the end
                if( it + 1 != str.end() ) {
                    cout << "\n  | ";
                }
            } else {
                cout << *it;
            }
        }
        cout << '\n';
    }
}